

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::flattenAnnotations(Config *this,string *parameter)

{
  int *piVar1;
  bool bVar2;
  allocator<char> local_31;
  string local_30;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  flatten_annotations = true;
  bVar2 = std::operator==(parameter,"screen");
  if (bVar2) {
    piVar1 = &((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->flatten_annotations_forbidden;
    *piVar1 = *piVar1 | 0x20;
  }
  else {
    bVar2 = std::operator==(parameter,"print");
    if (bVar2) {
      piVar1 = &((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->flatten_annotations_required;
      *piVar1 = *piVar1 | 4;
    }
    else {
      bVar2 = std::operator!=(parameter,"all");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"invalid flatten-annotations option",&local_31);
        usage(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::flattenAnnotations(std::string const& parameter)
{
    o.m->flatten_annotations = true;
    if (parameter == "screen") {
        o.m->flatten_annotations_forbidden |= an_no_view;
    } else if (parameter == "print") {
        o.m->flatten_annotations_required |= an_print;
    } else if (parameter != "all") {
        usage("invalid flatten-annotations option");
    }
    return this;
}